

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringAtoRealMethod::eval
          (StringAtoRealMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  real_t real;
  string_view str_00;
  bool bVar1;
  undefined1 uVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  ConstantValue *this_00;
  __sv_type _Var3;
  optional<double> oVar4;
  double result;
  string str;
  ConstantValue cv;
  nullptr_t in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  Expression *in_stack_ffffffffffffff08;
  real_t in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined8 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff08,
                   (EvalContext *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x925534);
  if (bVar1) {
    slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x92558a);
    std::__cxx11::string::string
              (in_stack_ffffffffffffff40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff38.v);
    std::erase<char,std::char_traits<char>,std::allocator<char>,char>
              (in_stack_ffffffffffffff48._8_8_,in_stack_ffffffffffffff48._0_8_);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    str_00._M_str._0_1_ = in_stack_ffffffffffffff60;
    str_00._M_len = in_stack_ffffffffffffff58;
    str_00._M_str._1_7_ = in_stack_ffffffffffffff61;
    oVar4 = strToDouble(str_00,(size_t *)_Var3._M_str);
    uVar2 = oVar4.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    this_00 = (ConstantValue *)
              std::optional<double>::value_or<double>
                        ((optional<double> *)
                         oVar4.super__Optional_base<double,_true,_true>._M_payload.
                         super__Optional_payload_base<double>._M_payload,
                         (double *)CONCAT17(uVar2,in_stack_ffffffffffffff00));
    real_t::real_t((real_t *)&stack0xffffffffffffff38,(double)this_00);
    real.v._7_1_ = uVar2;
    real.v._0_7_ = in_stack_ffffffffffffff00;
    slang::ConstantValue::ConstantValue(this_00,real);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff00));
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9256a0);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto cv = args[0]->eval(context);
        if (!cv)
            return nullptr;

        std::string str = cv.str();
        std::erase(str, '_');

        double result = strToDouble(str).value_or(0.0);
        return real_t(result);
    }